

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void print_bb_insn_value(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  MIR_context_t ctx;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    pcVar3 = "may/must alloca ";
    ctx = gen_ctx->ctx;
    if ((bb_insn->alloca_flag & 3) == 0) {
      pcVar3 = "must alloca";
    }
    pcVar1 = "const val";
    pcVar2 = "";
    if (bb_insn->alloca_flag != 0) {
      pcVar2 = pcVar3;
    }
    if (bb_insn->gvn_val_const_p == '\0') {
      pcVar1 = "val";
    }
    fprintf((FILE *)gen_ctx->debug_file,"%s%s=%lld for insn %lu:",pcVar2,pcVar1,bb_insn->gvn_val,
            (ulong)bb_insn->index);
    MIR_output_insn(ctx,gen_ctx->debug_file,bb_insn->insn,(gen_ctx->curr_func_item->u).func,1);
    return;
  }
  return;
}

Assistant:

static void print_bb_insn_value (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  MIR_context_t ctx = gen_ctx->ctx;

  DEBUG (2, {
    fprintf (debug_file, "%s%s=%lld for insn %lu:",
             !bb_insn->alloca_flag                               ? ""
             : bb_insn->alloca_flag & (MAY_ALLOCA | MUST_ALLOCA) ? "may/must alloca "
             : bb_insn->alloca_flag & MAY_ALLOCA                 ? "may alloca"
                                                                 : "must alloca",
             bb_insn->gvn_val_const_p ? "const val" : "val", (long long) bb_insn->gvn_val,
             (unsigned long) bb_insn->index);
    MIR_output_insn (ctx, debug_file, bb_insn->insn, curr_func_item->u.func, TRUE);
  });
}